

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

RandomBernoulliStaticLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_randombernoullistatic(NeuralNetworkLayer *this)

{
  bool bVar1;
  RandomBernoulliStaticLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_randombernoullistatic(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_randombernoullistatic(this);
    this_00 = (RandomBernoulliStaticLayerParams *)operator_new(0x38);
    RandomBernoulliStaticLayerParams::RandomBernoulliStaticLayerParams(this_00);
    (this->layer_).randombernoullistatic_ = this_00;
  }
  return (RandomBernoulliStaticLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::RandomBernoulliStaticLayerParams* NeuralNetworkLayer::mutable_randombernoullistatic() {
  if (!has_randombernoullistatic()) {
    clear_layer();
    set_has_randombernoullistatic();
    layer_.randombernoullistatic_ = new ::CoreML::Specification::RandomBernoulliStaticLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.randomBernoulliStatic)
  return layer_.randombernoullistatic_;
}